

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

int __thiscall input_mod::decode_run(input_mod *this,void *buffer,uint size)

{
  DUMB_IT_SIGRENDERER *pDVar1;
  long lVar2;
  uint in_stack_ffffffffffffffb0;
  int written;
  sample_t_conflict **buf;
  long samples;
  int dt;
  DUMB_IT_SIGRENDERER *itsr;
  sample_t_conflict *psStack_20;
  uint size_local;
  void *buffer_local;
  input_mod *this_local;
  
  if ((this->eof & 1U) == 0) {
    psStack_20 = (sample_t_conflict *)buffer;
    buffer_local = this;
    pDVar1 = duh_get_it_sigrenderer((DUH_SIGRENDERER *)0x41170a);
    buf = (sample_t_conflict **)
          (((long)pDVar1->time_left << 0x10 | (long)pDVar1->sub_time_left) /
          (long)(int)(this->delta * 65536.0 + 0.5));
    if ((buf == (sample_t_conflict **)0x0) || ((long)(ulong)size < (long)buf)) {
      buf = (sample_t_conflict **)(ulong)size;
    }
    do {
      dumb_silence((sample_t_conflict *)(ulong)in_stack_ffffffffffffffb0,
                   (int32)((ulong)this >> 0x20));
      lVar2 = render(this,1.0,this->delta,(long)buf,&stack0xffffffffffffffe0);
      this_local._4_4_ = (int)lVar2;
      if ((this->eof & 1U) != 0) {
        return 0;
      }
    } while (this_local._4_4_ == 0);
    if (this_local._4_4_ == -1) {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int input_mod::decode_run(void *buffer, unsigned int size)
{
	if (eof) return 0;

	DUMB_IT_SIGRENDERER *itsr = duh_get_it_sigrenderer(sr);
	int dt = int(delta * 65536.0 + 0.5);
	long samples = long((((LONG_LONG)itsr->time_left << 16) | itsr->sub_time_left) / dt);
	if (samples == 0 || samples > (long)size) samples = size;
	sample_t **buf = (sample_t **)&buffer;
	int written = 0;

retry:
	dumb_silence(buf[0], size * 2);
	written = render(1, delta, samples, buf);

	if (eof) return false;
	else if (written == 0) goto retry;
	else if (written == -1) return -1;

	return written;
}